

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

char * get_hostname(void)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *local_18;
  char *hostname;
  size_t size;
  
  hostname = (char *)0x0;
  local_18 = (char *)0x0;
  while( true ) {
    local_18 = (char *)safegrowarray(local_18,(size_t *)&hostname,1,(size_t)hostname,1,false);
    iVar1 = gethostname(local_18,(size_t)hostname);
    if ((iVar1 < 0) && (piVar2 = __errno_location(), *piVar2 != 0x24)) break;
    pcVar3 = (char *)strlen(local_18);
    if (pcVar3 < hostname + -1) {
      return local_18;
    }
  }
  safefree(local_18);
  return (char *)0x0;
}

Assistant:

char *get_hostname(void)
{
    size_t size = 0;
    char *hostname = NULL;
    do {
        sgrowarray(hostname, size, size);
        if ((gethostname(hostname, size) < 0) && (errno != ENAMETOOLONG)) {
            sfree(hostname);
            hostname = NULL;
            break;
        }
    } while (strlen(hostname) >= size-1);
    return hostname;
}